

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

int m256v_iszero(m256v *M)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int r;
  int iVar4;
  
  iVar1 = M->n_row;
  iVar4 = 0;
  iVar2 = 0;
  if (0 < iVar1) {
    iVar4 = iVar1;
    iVar2 = 0;
  }
  do {
    r = iVar2;
    if (iVar4 == r) break;
    iVar3 = m256v_row_iszero(M,r);
    iVar2 = r + 1;
  } while (iVar3 != 0);
  return (int)(iVar1 <= r);
}

Assistant:

int MV_GEN_N(_iszero)(const MV_GEN_TYPE* M)
{
	for (int r = 0; r < M->n_row; ++r) {
		if (!MV_GEN_N(_row_iszero)(M, r)) {
			return 0;
		}
	}
	return 1;
}